

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra.cc
# Opt level: O3

string * format_system_error_abi_cxx11_
                   (string *__return_storage_ptr__,int error_code,string_view message)

{
  memory_buffer out;
  buffer local_238;
  char local_218 [504];
  
  local_238.size_ = 0;
  local_238._vptr_basic_buffer = (_func_int **)&PTR_grow_0017df90;
  local_238.capacity_ = 500;
  local_238.ptr_ = local_218;
  fmt::v5::format_system_error(&local_238,error_code,message);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_238.ptr_,local_238.ptr_ + local_238.size_);
  local_238._vptr_basic_buffer = (_func_int **)&PTR_grow_0017df90;
  if (local_238.ptr_ != local_218) {
    operator_delete(local_238.ptr_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string format_system_error(int error_code, fmt::string_view message) {
  fmt::memory_buffer out;
  format_system_error(out, error_code, message);
  return to_string(out);
}